

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void handle_C_option(char *z)

{
  option_type oVar1;
  char *__s1;
  code *pcVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char **ppcVar6;
  ulong uVar7;
  FILE *extraout_RDX;
  long lVar8;
  s_options *psVar9;
  FILE *__stream;
  char *pcVar10;
  char **__s;
  int iVar11;
  int n;
  long lVar12;
  double dVar13;
  char *pcStack_98;
  FILE *pFStack_90;
  double dStack_88;
  char **ppcStack_80;
  char **ppcStack_78;
  long lStack_70;
  
  sVar4 = strlen(z);
  lVar8 = sVar4 << 0x20;
  pcVar10 = (char *)(lVar8 + 0x200000000 >> 0x20);
  pcVar5 = (char *)malloc((size_t)pcVar10);
  output_dir = pcVar5;
  if (pcVar5 != (char *)0x0) {
    strcpy(pcVar5,z);
    if (pcVar5[lVar8 + -0x100000000 >> 0x20] != '/') {
      pcVar5[lVar8 >> 0x20] = '/';
      pcVar5[lVar8 + 0x100000000 >> 0x20] = '\0';
    }
    return;
  }
  handle_C_option_cold_1();
  lVar8 = (long)nDefine;
  nDefine = nDefine + 1;
  psVar9 = (s_options *)(lVar8 * 8 + 8);
  ppcVar6 = (char **)realloc(azDefine,(size_t)psVar9);
  if (ppcVar6 == (char **)0x0) {
    __s = azDefine;
    azDefine = ppcVar6;
    handle_D_option_cold_2();
  }
  else {
    azDefine = ppcVar6;
    sVar4 = strlen(pcVar10);
    __s = (char **)(long)((int)sVar4 + 1);
    pcVar5 = (char *)malloc((size_t)__s);
    ppcVar6[lVar8] = pcVar5;
    if (pcVar5 != (char *)0x0) {
      strcpy(pcVar5,pcVar10);
      for (; (*pcVar5 != '\0' && (*pcVar5 != '=')); pcVar5 = pcVar5 + 1) {
      }
      *pcVar5 = '\0';
      return;
    }
  }
  handle_D_option_cold_1();
  sVar4 = strlen((char *)__s);
  ppcVar6 = (char **)(long)((int)sVar4 + 1);
  user_templatename = (char *)malloc((size_t)ppcVar6);
  if (user_templatename != (char *)0x0) {
    strcpy(user_templatename,(char *)__s);
    return;
  }
  handle_T_option_cold_1();
  argv = ppcVar6;
  op = psVar9;
  errstream = (FILE *)extraout_RDX;
  if ((((ppcVar6 != (char **)0x0) && (psVar9 != (s_options *)0x0)) && (*ppcVar6 != (char *)0x0)) &&
     (pcVar5 = ppcVar6[1], pcVar5 != (char *)0x0)) {
    lVar12 = 1;
    iVar11 = 0;
    __stream = extraout_RDX;
    pFStack_90 = extraout_RDX;
    ppcStack_80 = ppcVar6;
    ppcStack_78 = __s;
    lStack_70 = lVar8;
    do {
      ppcVar6 = argv;
      n = (int)lVar12;
      if ((*pcVar5 == '-') || (*pcVar5 == '+')) {
        pcVar5 = op->label;
        if (pcVar5 != (char *)0x0) {
          pcVar10 = argv[lVar12];
          psVar9 = op;
          do {
            sVar4 = strlen(pcVar5);
            iVar3 = strncmp(pcVar10 + 1,pcVar5,(long)(int)sVar4);
            if (iVar3 == 0) {
              if (psVar9->label != (char *)0x0) {
                pcVar2 = (code *)psVar9->arg;
                iVar3 = 0;
                if (pcVar2 == (code *)0x0) goto LAB_00106122;
                oVar1 = psVar9->type;
                if (oVar1 == OPT_FSTR) {
                  (*pcVar2)(pcVar10 + 2);
                  goto LAB_00106122;
                }
                if (oVar1 == OPT_FFLAG) {
                  (*pcVar2)();
                  goto LAB_00106122;
                }
                if (oVar1 == OPT_FLAG) {
                  *(uint *)pcVar2 = (uint)(*pcVar10 == '-');
                  goto LAB_00106122;
                }
                if (__stream == (FILE *)0x0) goto LAB_0010611d;
                pcVar5 = "%smissing argument on switch.\n";
                goto LAB_00105f42;
              }
              break;
            }
            pcVar5 = psVar9[1].label;
            psVar9 = psVar9 + 1;
          } while (pcVar5 != (char *)0x0);
        }
        if (__stream == (FILE *)0x0) {
LAB_0010611d:
          iVar3 = 1;
        }
        else {
          pcVar5 = "%sundefined option.\n";
LAB_00105f42:
          fprintf(__stream,pcVar5,emsg);
          iVar3 = 1;
          errline(n,1,(FILE *)__stream);
        }
LAB_00106122:
        iVar11 = iVar11 + iVar3;
      }
      else {
        pcVar5 = strchr(pcVar5,0x3d);
        if (pcVar5 != (char *)0x0) {
          pcVar5 = strchr(ppcVar6[lVar12],0x3d);
          if (pcVar5 == (char *)0x0) {
            __assert_fail("cp!=0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                          ,0x78a,"int handleswitch(int, FILE *)");
          }
          *pcVar5 = '\0';
          psVar9 = op;
          pcVar10 = op->label;
          if (pcVar10 == (char *)0x0) {
            lVar8 = 0;
          }
          else {
            __s1 = ppcVar6[lVar12];
            ppcVar6 = &op[1].label;
            lVar8 = 0;
            do {
              iVar3 = strcmp(__s1,pcVar10);
              if (iVar3 == 0) break;
              lVar8 = lVar8 + 1;
              pcVar10 = *ppcVar6;
              ppcVar6 = ppcVar6 + 4;
            } while (pcVar10 != (char *)0x0);
          }
          __stream = pFStack_90;
          *pcVar5 = '=';
          if (psVar9[lVar8].label == (char *)0x0) {
            iVar3 = 1;
            if (pFStack_90 != (FILE *)0x0) {
              fprintf(pFStack_90,"%sundefined option.\n",emsg);
              errline(n,0,(FILE *)__stream);
            }
          }
          else {
            oVar1 = psVar9[lVar8].type;
            dVar13 = 0.0;
            if (oVar1 - OPT_FLAG < 8) {
              pcVar5 = pcVar5 + 1;
              switch(oVar1) {
              default:
                if (pFStack_90 != (FILE *)0x0) {
                  fprintf(pFStack_90,"%soption requires an argument.\n",emsg);
                  errline(n,0,(FILE *)__stream);
                  dVar13 = 0.0;
                }
                break;
              case OPT_INT:
              case OPT_FINT:
                iVar3 = 0;
                uVar7 = strtol(pcVar5,&pcStack_98,0);
                pcVar5 = pcStack_98;
                if ((*pcStack_98 != '\0') && (iVar3 = 1, __stream != (FILE *)0x0)) {
                  fprintf(__stream,"%sillegal character in integer argument.\n",emsg);
                  errline(n,(int)pcVar5 - *(int *)(argv + lVar12),(FILE *)__stream);
                }
                pcVar5 = (char *)0x0;
                dVar13 = 0.0;
                goto LAB_00106137;
              case OPT_DBL:
              case OPT_FDBL:
                dVar13 = strtod(pcVar5,&pcStack_98);
                pcVar5 = pcStack_98;
                if (*pcStack_98 == '\0') goto LAB_00106132;
                if (__stream != (FILE *)0x0) {
                  dStack_88 = dVar13;
                  fprintf(__stream,"%sillegal character in floating-point argument.\n",emsg);
                  errline(n,(int)pcVar5 - *(int *)(argv + lVar12),(FILE *)__stream);
                  dVar13 = dStack_88;
                }
                break;
              case OPT_STR:
              case OPT_FSTR:
                goto switchD_00105faa_caseD_4;
              }
              uVar7 = 0;
              iVar3 = 1;
              pcVar5 = (char *)0x0;
            }
            else {
LAB_00106132:
              pcVar5 = (char *)0x0;
switchD_00105faa_caseD_4:
              uVar7 = 0;
              iVar3 = 0;
            }
LAB_00106137:
            switch(op[lVar8].type) {
            case OPT_INT:
              *(int *)op[lVar8].arg = (int)uVar7;
              break;
            case OPT_DBL:
              *(double *)op[lVar8].arg = dVar13;
              break;
            case OPT_STR:
              *(char **)op[lVar8].arg = pcVar5;
              break;
            case OPT_FINT:
              (*(code *)op[lVar8].arg)(uVar7 & 0xffffffff);
              break;
            case OPT_FDBL:
              (*(code *)op[lVar8].arg)();
              break;
            case OPT_FSTR:
              (*(code *)op[lVar8].arg)(pcVar5);
            }
          }
          iVar11 = iVar3 + iVar11;
        }
      }
      pcVar5 = argv[lVar12 + 1];
      lVar12 = lVar12 + 1;
    } while (pcVar5 != (char *)0x0);
    if (0 < iVar11) {
      fprintf(__stream,"Valid command line options for \"%s\" are:\n",*ppcStack_80);
      OptPrint();
      exit(1);
    }
  }
  return;
}

Assistant:

static void handle_C_option(char *z){
  int len = lemonStrlen(z);
  output_dir = (char *) malloc( len+2 );
  if( output_dir==0 ){
    memory_error();
  }
  strcpy(output_dir, z);
  if( !is_seperator(output_dir[len-1]) ){
    output_dir[len] = '/';
    output_dir[len+1] = '\0';
  }
}